

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O0

void test_3d_dynamic<15ul,30ul,30ul>(void)

{
  dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL> d;
  int iVar1;
  int iVar2;
  tuple<int,_int,_int> *ptVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  ulong uVar7;
  size_type sVar8;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var9;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var10;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var11;
  reference pvVar12;
  long lVar13;
  tuple<int,_int,_int> *local_100;
  tuple<int,_int,_int> *local_f8;
  size_type local_f0;
  unsigned_long local_e8;
  value_type true_idx;
  int local_d8;
  int i;
  int j;
  int k;
  tuple<int,_int,_int> *dptr;
  allocator<std::tuple<int,_int,_int>_> local_b1;
  undefined1 local_b0 [8];
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> data;
  size_type local_90;
  unsigned_long local_88;
  size_type local_80;
  int local_74;
  size_type local_70;
  int local_64;
  size_type local_60;
  int local_54;
  size_type local_50;
  bool local_42;
  bool local_41;
  dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL> local_40;
  undefined1 local_28 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
  l;
  
  std::experimental::
  dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
  dimensions<unsigned_long,_unsigned_long,_unsigned_long,_nullptr>(&local_40,0xf,0x1e,0x1e);
  d.dynamic_dims_._M_elems[1] = local_40.dynamic_dims_._M_elems[1];
  d.dynamic_dims_._M_elems[0] = local_40.dynamic_dims_._M_elems[0];
  d.dynamic_dims_._M_elems[2] = local_40.dynamic_dims_._M_elems[2];
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
              *)local_28,d);
  local_41 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
             ::is_regular();
  local_42 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf5,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",&local_41,&local_42);
  local_50 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
                       *)local_28,0);
  local_54 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf7,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",&local_50,&local_54);
  local_60 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
                       *)local_28,1);
  local_64 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf8,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",&local_60,&local_64);
  local_70 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
                       *)local_28,2);
  local_74 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(2))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xf9,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",&local_70,&local_74);
  local_80 = std::experimental::
             dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
             size((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                   *)local_28);
  vVar4 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_28,0);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_28,1);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_28,2);
  local_88 = vVar4 * vVar5 * vVar6;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xfb,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",&local_80,&local_88);
  local_90 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
             ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>_>
                     *)local_28);
  vVar4 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_28,0);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_28,1);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_28,2);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(vVar4 * vVar5 * vVar6);
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xfc,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",&local_90,
             (unsigned_long *)
             &data.
              super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  vVar4 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_28,0);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_28,1);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_28,2);
  std::allocator<std::tuple<int,_int,_int>_>::allocator(&local_b1);
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
             local_b0,vVar4 * vVar5 * vVar6,&local_b1);
  std::allocator<std::tuple<int,_int,_int>_>::~allocator(&local_b1);
  _j = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::data
                 ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
                  local_b0);
  i = 0;
  while( true ) {
    uVar7 = (ulong)i;
    vVar4 = std::experimental::
            dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                             *)local_28,2);
    if (vVar4 <= uVar7) break;
    local_d8 = 0;
    while( true ) {
      uVar7 = (ulong)local_d8;
      vVar4 = std::experimental::
              dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                               *)local_28,1);
      if (vVar4 <= uVar7) break;
      true_idx._4_4_ = 0;
      while( true ) {
        uVar7 = (ulong)true_idx._4_4_;
        vVar4 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)local_28,0);
        if (vVar4 <= uVar7) break;
        vVar4 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)local_28,1);
        vVar5 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)local_28,2);
        lVar13 = (long)true_idx._4_4_;
        vVar6 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)local_28,2);
        local_e8 = vVar4 * vVar5 * lVar13 + vVar6 * (long)local_d8 + (long)i;
        local_f0 = std::experimental::
                   layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                   ::index<int,int,int>
                             ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                               *)local_28,true_idx._4_4_,local_d8,i);
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x108,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",&local_f0,
                   &local_e8);
        ptVar3 = _j;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        local_f8 = ptVar3 + sVar8;
        local_100 = _j + local_e8;
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x10a,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",&local_f8,
                   &local_100);
        ptVar3 = _j;
        iVar1 = true_idx._4_4_;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        p_Var9 = std::get<0ul,int,int,int>(ptVar3 + sVar8);
        ptVar3 = _j;
        iVar2 = local_d8;
        *p_Var9 = iVar1;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        p_Var10 = std::get<1ul,int,int,int>(ptVar3 + sVar8);
        ptVar3 = _j;
        iVar1 = i;
        *p_Var10 = iVar2;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        p_Var11 = std::get<2ul,int,int,int>(ptVar3 + sVar8);
        ptVar3 = _j;
        *p_Var11 = iVar1;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        p_Var9 = std::get<0ul,int,int,int>(ptVar3 + sVar8);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x110,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",p_Var9,
                   (int *)((long)&true_idx + 4));
        ptVar3 = _j;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        p_Var10 = std::get<1ul,int,int,int>(ptVar3 + sVar8);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x111,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",p_Var10,&local_d8)
        ;
        ptVar3 = _j;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        p_Var11 = std::get<2ul,int,int,int>(ptVar3 + sVar8);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x112,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",p_Var11,&i);
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        pvVar12 = std::
                  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::at
                            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                              *)local_b0,sVar8);
        p_Var9 = std::get<0ul,int,int,int>(pvVar12);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(data.at(l.index(i, j, k))))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x115,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",p_Var9,
                   (int *)((long)&true_idx + 4));
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        pvVar12 = std::
                  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::at
                            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                              *)local_b0,sVar8);
        p_Var10 = std::get<1ul,int,int,int>(pvVar12);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(data.at(l.index(i, j, k))))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x116,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",p_Var10,&local_d8)
        ;
        sVar8 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                ::index<int,int,int>
                          ((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>>
                            *)local_28,true_idx._4_4_,local_d8,i);
        pvVar12 = std::
                  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::at
                            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                              *)local_b0,sVar8);
        p_Var11 = std::get<2ul,int,int,int>(pvVar12);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(data.at(l.index(i, j, k))))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0x117,"void test_3d_dynamic() [X = 15UL, Y = 30UL, Z = 30UL]",p_Var11,&i);
        true_idx._4_4_ = true_idx._4_4_ + 1;
      }
      local_d8 = local_d8 + 1;
    }
    i = i + 1;
  }
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::~vector
            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
             local_b0);
  return;
}

Assistant:

void test_3d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, dyn, dyn>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    > const l{{X, Y, Z}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);
    BOOST_TEST_EQ((l.stride(2)), 1);

    BOOST_TEST_EQ((l.size()), l[0] * l[1] * l[2]);
    BOOST_TEST_EQ((l.span()), l[0] * l[1] * l[2]);

    vector<tuple<int, int, int> > data(l[0] * l[1] * l[2]);
    tuple<int, int, int>* dptr = data.data();

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (l[2]) * (i) + (l[2]) * (j) + (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 

        // Bounds-checking.
        BOOST_TEST_EQ((std::get<0>(data.at(l.index(i, j, k)))), i); 
        BOOST_TEST_EQ((std::get<1>(data.at(l.index(i, j, k)))), j); 
        BOOST_TEST_EQ((std::get<2>(data.at(l.index(i, j, k)))), k); 
    }
}